

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# respond_test.c
# Opt level: O1

void test_resp_poll_writeable(void)

{
  _Bool _Var1;
  nng_err nVar2;
  int iVar3;
  nng_err num;
  char *pcVar4;
  int local_88 [2];
  char buf_ [64];
  size_t sz_;
  nng_socket local_38;
  nng_socket surv;
  nng_socket resp;
  int fd;
  
  nVar2 = nng_surveyor0_open((nng_socket *)((long)&sz_ + 4));
  pcVar4 = nng_strerror(nVar2);
  iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/respond_test.c"
                         ,0x39,"%s: expected success, got %s (%d)","nng_surveyor0_open(&surv)",
                         pcVar4,nVar2);
  if (iVar3 != 0) {
    nVar2 = nng_respondent0_open(&local_38);
    pcVar4 = nng_strerror(nVar2);
    iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/respond_test.c"
                           ,0x3a,"%s: expected success, got %s (%d)","nng_respondent0_open(&resp)",
                           pcVar4,nVar2);
    if (iVar3 != 0) {
      nVar2 = nng_socket_get_send_poll_fd(local_38,(int *)&surv);
      pcVar4 = nng_strerror(nVar2);
      iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/respond_test.c"
                             ,0x3b,"%s: expected success, got %s (%d)",
                             "nng_socket_get_send_poll_fd(resp, &fd)",pcVar4,nVar2);
      if (iVar3 != 0) {
        acutest_check_(~surv.id >> 0x1f,
                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/respond_test.c"
                       ,0x3c,"%s","fd >= 0");
        _Var1 = nuts_poll_fd(surv.id);
        acutest_check_((uint)!_Var1,
                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/respond_test.c"
                       ,0x3f,"%s","nuts_poll_fd(fd) == false");
        nVar2 = nuts_marry(sz_._4_4_,local_38);
        pcVar4 = nng_strerror(nVar2);
        iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/respond_test.c"
                               ,0x41,"%s: expected success, got %s (%d)","nuts_marry(surv, resp)",
                               pcVar4,nVar2);
        if (iVar3 != 0) {
          _Var1 = nuts_poll_fd(surv.id);
          acutest_check_((uint)!_Var1,
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/respond_test.c"
                         ,0x44,"%s","nuts_poll_fd(fd) == false");
          nVar2 = nng_send(sz_._4_4_,"abc",4,0);
          pcVar4 = nng_strerror(nVar2);
          iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/respond_test.c"
                                 ,0x47,"%s: expected success, got %s (%d)",
                                 "nng_send(surv, \"abc\", strlen(\"abc\") + 1, 0)",pcVar4,nVar2);
          if (iVar3 != 0) {
            buf_[0x38] = '@';
            buf_[0x39] = '\0';
            buf_[0x3a] = '\0';
            buf_[0x3b] = '\0';
            buf_[0x3c] = '\0';
            buf_[0x3d] = '\0';
            buf_[0x3e] = '\0';
            buf_[0x3f] = '\0';
            num = nng_recv(local_38,local_88,(size_t *)(buf_ + 0x38),0);
            pcVar4 = nng_strerror(num);
            acutest_check_((uint)(num == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/respond_test.c"
                           ,0x48,"nng_recv (%d %s)",(ulong)num,pcVar4,nVar2);
            acutest_check_((uint)(buf_._56_8_ == 4),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/respond_test.c"
                           ,0x48,"length %d want %d",buf_._56_8_,4);
            buf_[0x37] = '\0';
            acutest_check_((uint)(local_88[0] == 0x636261),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/respond_test.c"
                           ,0x48,"%s == %s","abc",local_88);
            _Var1 = nuts_poll_fd(surv.id);
            acutest_check_((uint)_Var1,
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/respond_test.c"
                           ,0x49,"%s","nuts_poll_fd(fd) == true");
            nVar2 = nng_send(local_38,"def",4,0);
            pcVar4 = nng_strerror(nVar2);
            iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/respond_test.c"
                                   ,0x4c,"%s: expected success, got %s (%d)",
                                   "nng_send(resp, \"def\", strlen(\"def\") + 1, 0)",pcVar4,nVar2);
            if (iVar3 != 0) {
              _Var1 = nuts_poll_fd(surv.id);
              acutest_check_((uint)!_Var1,
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/respond_test.c"
                             ,0x4d,"%s","nuts_poll_fd(fd) == false");
              buf_[0x38] = '@';
              buf_[0x39] = '\0';
              buf_[0x3a] = '\0';
              buf_[0x3b] = '\0';
              buf_[0x3c] = '\0';
              buf_[0x3d] = '\0';
              buf_[0x3e] = '\0';
              buf_[0x3f] = '\0';
              nVar2 = nng_recv(sz_._4_4_,local_88,(size_t *)(buf_ + 0x38),0);
              pcVar4 = nng_strerror(nVar2);
              acutest_check_((uint)(nVar2 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/respond_test.c"
                             ,0x4f,"nng_recv (%d %s)",(ulong)nVar2,pcVar4);
              acutest_check_((uint)(buf_._56_8_ == 4),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/respond_test.c"
                             ,0x4f,"length %d want %d",buf_._56_8_,4);
              buf_[0x37] = '\0';
              acutest_check_((uint)(local_88[0] == 0x666564),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/respond_test.c"
                             ,0x4f,"%s == %s","def",local_88);
              _Var1 = nuts_poll_fd(surv.id);
              acutest_check_((uint)!_Var1,
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/respond_test.c"
                             ,0x50,"%s","nuts_poll_fd(fd) == false");
              nVar2 = nng_socket_close(sz_._4_4_);
              pcVar4 = nng_strerror(nVar2);
              iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/respond_test.c"
                                     ,0x52,"%s: expected success, got %s (%d)",
                                     "nng_socket_close(surv)",pcVar4,nVar2);
              if (iVar3 != 0) {
                nVar2 = nng_socket_close(local_38);
                pcVar4 = nng_strerror(nVar2);
                iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/respond_test.c"
                                       ,0x53,"%s: expected success, got %s (%d)",
                                       "nng_socket_close(resp)",pcVar4,nVar2);
                if (iVar3 != 0) {
                  return;
                }
              }
            }
          }
        }
      }
    }
  }
  acutest_abort_();
}

Assistant:

void
test_resp_poll_writeable(void)
{
	int        fd;
	nng_socket surv;
	nng_socket resp;

	NUTS_PASS(nng_surveyor0_open(&surv));
	NUTS_PASS(nng_respondent0_open(&resp));
	NUTS_PASS(nng_socket_get_send_poll_fd(resp, &fd));
	NUTS_TRUE(fd >= 0);

	// Not writable before connect.
	NUTS_TRUE(nuts_poll_fd(fd) == false);

	NUTS_MARRY(surv, resp);

	// Still not writable.
	NUTS_TRUE(nuts_poll_fd(fd) == false);

	// If we get a job, *then* we become writable
	NUTS_SEND(surv, "abc");
	NUTS_RECV(resp, "abc");
	NUTS_TRUE(nuts_poll_fd(fd) == true);

	// And is no longer writable once we send a message
	NUTS_SEND(resp, "def");
	NUTS_TRUE(nuts_poll_fd(fd) == false);
	// Even after receiving it
	NUTS_RECV(surv, "def");
	NUTS_TRUE(nuts_poll_fd(fd) == false);

	NUTS_CLOSE(surv);
	NUTS_CLOSE(resp);
}